

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O2

void __thiscall
FxMinMax::FxMinMax(FxMinMax *this,TArray<FxExpression_*,_FxExpression_*> *expr,FName *type,
                  FScriptPosition *pos)

{
  uint uVar1;
  ulong uVar2;
  
  FxExpression::FxExpression(&this->super_FxExpression,pos);
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxMinMax_007e8ca0;
  (this->choices).super_TArray<FxExpression_*,_FxExpression_*>.Array = (FxExpression **)0x0;
  (this->choices).super_TArray<FxExpression_*,_FxExpression_*>.Most = 0;
  (this->choices).super_TArray<FxExpression_*,_FxExpression_*>.Count = 0;
  uVar1 = type->Index;
  (this->Type).Index = uVar1;
  if (expr->Count == 0) {
    __assert_fail("expr.Size() > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_expression.cpp"
                  ,0x9c4,
                  "FxMinMax::FxMinMax(TArray<FxExpression *> &, FName, const FScriptPosition &)");
  }
  if ((uVar1 & 0xfffffffe) == 0x23a) {
    TArray<FxExpression_*,_FxExpression_*>::Resize
              (&(this->choices).super_TArray<FxExpression_*,_FxExpression_*>,expr->Count);
    uVar1 = expr->Count;
    for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      (this->choices).super_TArray<FxExpression_*,_FxExpression_*>.Array[uVar2] = expr->Array[uVar2]
      ;
    }
    return;
  }
  __assert_fail("type == NAME_Min || type == NAME_Max",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_expression.cpp"
                ,0x9c5,
                "FxMinMax::FxMinMax(TArray<FxExpression *> &, FName, const FScriptPosition &)");
}

Assistant:

FxMinMax::FxMinMax(TArray<FxExpression*> &expr, FName type, const FScriptPosition &pos)
: FxExpression(pos), Type(type)
{
	assert(expr.Size() > 0);
	assert(type == NAME_Min || type == NAME_Max);

	choices.Resize(expr.Size());
	for (unsigned i = 0; i < expr.Size(); ++i)
	{
		choices[i] = expr[i];
	}
}